

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O1

string * __thiscall
t_javame_generator::get_java_type_string_abi_cxx11_
          (string *__return_storage_ptr__,t_javame_generator *this,t_type *type)

{
  int iVar1;
  undefined4 extraout_var;
  runtime_error *prVar2;
  undefined4 extraout_var_00;
  long *plVar3;
  long *plVar4;
  char *pcVar5;
  char *pcVar6;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  do {
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xe])(type);
    if ((char)iVar1 != '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "TType.LIST";
      pcVar5 = "";
LAB_00281ee8:
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar6,pcVar5);
      return __return_storage_ptr__;
    }
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0x10])(type);
    if ((char)iVar1 != '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "TType.MAP";
      pcVar5 = "";
      goto LAB_00281ee8;
    }
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xf])(type);
    if ((char)iVar1 != '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "TType.SET";
      pcVar5 = "";
      goto LAB_00281ee8;
    }
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xb])(type);
    if (((char)iVar1 != '\0') ||
       (iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xc])(type),
       (char)iVar1 != '\0')) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "TType.STRUCT";
      pcVar5 = "";
      goto LAB_00281ee8;
    }
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[10])(type);
    if ((char)iVar1 != '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "TType.ENUM";
      pcVar5 = "";
      goto LAB_00281ee8;
    }
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[9])(type);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[5])(type);
      if ((char)iVar1 == '\0') {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[3])(type);
        std::operator+(&local_40,"Unknown thrift type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar1));
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
        local_60 = (long *)*plVar3;
        plVar4 = plVar3 + 2;
        if (local_60 == plVar4) {
          local_50 = *plVar4;
          lStack_48 = plVar3[3];
          local_60 = &local_50;
        }
        else {
          local_50 = *plVar4;
        }
        local_58 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::runtime_error::runtime_error(prVar2,(string *)&local_60);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      switch(*(undefined4 *)&((t_typedef *)type)->type_) {
      case 0:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "TType.VOID";
        pcVar5 = "";
        break;
      case 1:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "TType.STRING";
        pcVar5 = "";
        break;
      case 2:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "TType.BOOL";
        pcVar5 = "";
        break;
      case 3:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "TType.BYTE";
        pcVar5 = "";
        break;
      case 4:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "TType.I16";
        pcVar5 = "";
        break;
      case 5:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "TType.I32";
        pcVar5 = "";
        break;
      case 6:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "TType.I64";
        pcVar5 = "";
        break;
      case 7:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "TType.DOUBLE";
        pcVar5 = "";
        break;
      default:
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[3])(type);
        std::operator+(&local_40,"Unknown thrift type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var_00,iVar1));
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
        local_60 = (long *)*plVar3;
        plVar4 = plVar3 + 2;
        if (local_60 == plVar4) {
          local_50 = *plVar4;
          lStack_48 = plVar3[3];
          local_60 = &local_50;
        }
        else {
          local_50 = *plVar4;
        }
        local_58 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::runtime_error::runtime_error(prVar2,(string *)&local_60);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00281ee8;
    }
    type = t_typedef::get_type((t_typedef *)type);
  } while( true );
}

Assistant:

std::string t_javame_generator::get_java_type_string(t_type* type) {
  if (type->is_list()) {
    return "TType.LIST";
  } else if (type->is_map()) {
    return "TType.MAP";
  } else if (type->is_set()) {
    return "TType.SET";
  } else if (type->is_struct() || type->is_xception()) {
    return "TType.STRUCT";
  } else if (type->is_enum()) {
    return "TType.ENUM";
  } else if (type->is_typedef()) {
    return get_java_type_string(((t_typedef*)type)->get_type());
  } else if (type->is_base_type()) {
    switch (((t_base_type*)type)->get_base()) {
    case t_base_type::TYPE_VOID:
      return "TType.VOID";
      break;
    case t_base_type::TYPE_STRING:
      return "TType.STRING";
      break;
    case t_base_type::TYPE_BOOL:
      return "TType.BOOL";
      break;
    case t_base_type::TYPE_I8:
      return "TType.BYTE";
      break;
    case t_base_type::TYPE_I16:
      return "TType.I16";
      break;
    case t_base_type::TYPE_I32:
      return "TType.I32";
      break;
    case t_base_type::TYPE_I64:
      return "TType.I64";
      break;
    case t_base_type::TYPE_DOUBLE:
      return "TType.DOUBLE";
      break;
    default:
      throw std::runtime_error("Unknown thrift type \"" + type->get_name()
                               + "\" passed to t_javame_generator::get_java_type_string!");
      break; // This should never happen!
    }
  } else {
    throw std::runtime_error(
        "Unknown thrift type \"" + type->get_name()
        + "\" passed to t_javame_generator::get_java_type_string!"); // This should never happen!
  }
}